

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_handle_custom_dialogues.hpp
# Opt level: O3

void __thiscall
PatchHandleCustomDialogues::inject_data(PatchHandleCustomDialogues *this,ROM *rom,World *world)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t uVar2;
  string local_38;
  
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  uVar2 = md::ROM::inject_bytes
                    (rom,&(this->_custom_text_lut).
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_38);
  this->_custom_text_lut_addr = uVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  uVar2 = md::ROM::inject_bytes
                    (rom,&(this->_custom_text_script_words).
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_38);
  this->_custom_text_script_words_addr = uVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void inject_data(md::ROM& rom, World& world) override
    {
        _custom_text_lut_addr = rom.inject_bytes(_custom_text_lut);
        _custom_text_script_words_addr = rom.inject_bytes(_custom_text_script_words);
    }